

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# whitelist_impl.h
# Opt level: O0

int secp256k1_whitelist_hash_pubkey(secp256k1_scalar *output,secp256k1_gej *pubkey)

{
  int iVar1;
  undefined1 local_148 [8];
  secp256k1_ge ge;
  size_t size;
  undefined1 local_e0 [4];
  int overflow;
  secp256k1_sha256 sha;
  uchar c [33];
  uchar local_48 [8];
  uchar h [32];
  secp256k1_gej *pubkey_local;
  secp256k1_scalar *output_local;
  
  size._4_4_ = 0;
  ge.infinity = 0x21;
  ge._84_4_ = 0;
  secp256k1_ge_set_gej((secp256k1_ge *)local_148,pubkey);
  secp256k1_sha256_initialize((secp256k1_sha256 *)local_e0);
  iVar1 = secp256k1_eckey_pubkey_serialize
                    ((secp256k1_ge *)local_148,(uchar *)&sha.bytes,(size_t *)&ge.infinity,0x102);
  if (iVar1 != 0) {
    secp256k1_sha256_write((secp256k1_sha256 *)local_e0,(uchar *)&sha.bytes,ge._80_8_);
    secp256k1_sha256_finalize((secp256k1_sha256 *)local_e0,local_48);
    secp256k1_scalar_set_b32(output,local_48,(int *)((long)&size + 4));
    if ((size._4_4_ == 0) && (iVar1 = secp256k1_scalar_is_zero(output), iVar1 == 0)) {
      return 1;
    }
    secp256k1_scalar_clear(output);
  }
  return 0;
}

Assistant:

static int secp256k1_whitelist_hash_pubkey(secp256k1_scalar* output, secp256k1_gej* pubkey) {
    unsigned char h[32];
    unsigned char c[33];
    secp256k1_sha256 sha;
    int overflow = 0;
    size_t size = 33;
    secp256k1_ge ge;

    secp256k1_ge_set_gej(&ge, pubkey);

    secp256k1_sha256_initialize(&sha);
    if (!secp256k1_eckey_pubkey_serialize(&ge, c, &size, SECP256K1_EC_COMPRESSED)) {
        return 0;
    }
    secp256k1_sha256_write(&sha, c, size);
    secp256k1_sha256_finalize(&sha, h);

    secp256k1_scalar_set_b32(output, h, &overflow);
    if (overflow || secp256k1_scalar_is_zero(output)) {
        /* This return path is mathematically impossible to hit */
        secp256k1_scalar_clear(output);
        return 0;
    }
    return 1;
}